

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::GetRethrowLabel(TypeChecker *this,Index depth,Label **out_label)

{
  char cVar1;
  char cVar2;
  Result RVar3;
  Enum EVar4;
  long lVar5;
  uint uVar6;
  pointer pLVar7;
  ulong uVar8;
  ulong uVar9;
  uint __val;
  string __str;
  string candidates;
  long *local_70;
  uint local_68;
  long local_60 [2];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  RVar3 = GetLabel(this,depth,out_label);
  EVar4 = Error;
  if ((RVar3.enum_ != Error) && (EVar4 = Ok, (*out_label)->label_type != Catch)) {
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    pLVar7 = (this->label_stack_).
             super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(this->label_stack_).
                  super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7;
    if (lVar5 != 0) {
      uVar8 = 0;
      do {
        __val = (uint)uVar8;
        if (*(int *)((long)&pLVar7[~uVar8].label_type + lVar5) == 7) {
          if (local_48 != 0) {
            std::__cxx11::string::append((char *)&local_50);
          }
          cVar2 = '\x01';
          if (9 < __val) {
            cVar1 = '\x04';
            do {
              cVar2 = cVar1;
              uVar6 = (uint)uVar8;
              if (uVar6 < 100) {
                cVar2 = cVar2 + -2;
                goto LAB_0018c41b;
              }
              if (uVar6 < 1000) {
                cVar2 = cVar2 + -1;
                goto LAB_0018c41b;
              }
              if (uVar6 < 10000) goto LAB_0018c41b;
              uVar8 = uVar8 / 10000;
              cVar1 = cVar2 + '\x04';
            } while (99999 < uVar6);
            cVar2 = cVar2 + '\x01';
          }
LAB_0018c41b:
          local_70 = local_60;
          std::__cxx11::string::_M_construct((ulong)&local_70,cVar2);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,local_68,__val);
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
        uVar8 = (ulong)(__val + 1);
        pLVar7 = (this->label_stack_).
                 super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(this->label_stack_).
                      super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7;
        uVar9 = (lVar5 >> 3) * -0x71c71c71c71c71c7;
      } while (uVar8 <= uVar9 && uVar9 - uVar8 != 0);
    }
    if (local_48 == 0) {
      PrintError(this,"rethrow not in try catch block");
    }
    else {
      PrintError(this,"invalid rethrow depth: %u (catches: %s)",(ulong)depth,local_50);
    }
    *out_label = (Label *)0x0;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    EVar4 = Error;
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::GetRethrowLabel(Index depth, Label** out_label) {
  if (Failed(GetLabel(depth, out_label))) {
    return Result::Error;
  }

  if ((*out_label)->label_type == LabelType::Catch) {
    return Result::Ok;
  }

  std::string candidates;
  for (Index idx = 0; idx < label_stack_.size(); idx++) {
    LabelType type = label_stack_[label_stack_.size() - idx - 1].label_type;
    if (type == LabelType::Catch) {
      if (!candidates.empty()) {
        candidates.append(", ");
      }
      candidates.append(std::to_string(idx));
    }
  }

  if (candidates.empty()) {
    PrintError("rethrow not in try catch block");
  } else {
    PrintError("invalid rethrow depth: %" PRIindex " (catches: %s)", depth,
               candidates.c_str());
  }
  *out_label = nullptr;
  return Result::Error;
}